

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_rsassa_pss_verify_ext
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,
              mbedtls_md_type_t mgf1_hash_id,int expected_salt_len,uchar *sig)

{
  byte bVar1;
  int iVar2;
  mbedtls_md_info_t *pmVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  char *ilen;
  ulong slen;
  size_t sVar7;
  uchar *puVar8;
  bool bVar9;
  uchar zeros [8];
  uchar result [64];
  uchar buf [1024];
  mbedtls_md_context_t local_498;
  uchar local_480 [71];
  char acStack_439 [16];
  char acStack_429 [1017];
  
  if (mode == 1) {
    if (ctx->padding != 1) {
      return -0x4080;
    }
    sVar6 = ctx->len;
    if (sVar6 - 0x401 < 0xfffffffffffffc0f) {
      return -0x4080;
    }
  }
  else {
    sVar6 = ctx->len;
    if (sVar6 - 0x401 < 0xfffffffffffffc0f) {
      return -0x4080;
    }
    if (mode == 0) {
      iVar2 = mbedtls_rsa_public(ctx,sig,(uchar *)(acStack_439 + 1));
      goto LAB_0010ff3f;
    }
  }
  iVar2 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,(uchar *)(acStack_439 + 1));
LAB_0010ff3f:
  if ((iVar2 == 0) && (iVar2 = -0x4100, acStack_439[sVar6] == -0x44)) {
    if (md_alg != MBEDTLS_MD_NONE) {
      pmVar3 = mbedtls_md_info_from_type(md_alg);
      if (pmVar3 == (mbedtls_md_info_t *)0x0) {
        return -0x4080;
      }
      bVar1 = mbedtls_md_get_size(pmVar3);
      hashlen = (uint)bVar1;
    }
    pmVar3 = mbedtls_md_info_from_type(mgf1_hash_id);
    iVar2 = -0x4080;
    if (pmVar3 != (mbedtls_md_info_t *)0x0) {
      bVar1 = mbedtls_md_get_size(pmVar3);
      local_480[0] = '\0';
      local_480[1] = '\0';
      local_480[2] = '\0';
      local_480[3] = '\0';
      local_480[4] = '\0';
      local_480[5] = '\0';
      local_480[6] = '\0';
      local_480[7] = '\0';
      sVar4 = mbedtls_mpi_bitlen(&ctx->N);
      bVar9 = (sVar4 - 1 & 7) == 0;
      sVar7 = sVar6 - 1;
      if (!bVar9) {
        sVar7 = sVar6;
      }
      if ((byte)acStack_439[1] >> ((char)sVar4 + (char)sVar7 * -8 + 7U & 0x1f) == 0) {
        mbedtls_md_init(&local_498);
        iVar2 = mbedtls_md_setup(&local_498,pmVar3,0);
        if (iVar2 == 0) {
          slen = (ulong)bVar1;
          uVar5 = ~slen;
          puVar8 = (uchar *)(acStack_439 + (ulong)bVar9 + 1);
          mgf_mask(puVar8,uVar5 + sVar7,puVar8 + sVar7 + uVar5,slen,&local_498);
          acStack_439[1] =
               acStack_439[1] & (byte)(0xff >> ((char)sVar7 * '\b' - (char)(sVar4 - 1) & 0x1fU));
          do {
            if (*puVar8 != '\0') break;
            puVar8 = puVar8 + 1;
          } while (puVar8 < acStack_439 + sVar7 + 1);
          if ((puVar8 != (uchar *)(acStack_439 + sVar7 + 1)) && (*puVar8 == '\x01')) {
            puVar8 = puVar8 + 1;
            ilen = acStack_439 + ((sVar6 + uVar5) - (long)puVar8) + 1;
            if ((expected_salt_len == -1) || (ilen == (char *)(long)expected_salt_len)) {
              mbedtls_md_starts(&local_498);
              mbedtls_md_update(&local_498,local_480,8);
              mbedtls_md_update(&local_498,hash,(ulong)hashlen);
              mbedtls_md_update(&local_498,puVar8,(size_t)ilen);
              mbedtls_md_finish(&local_498,local_480 + 8);
              mbedtls_md_free(&local_498);
              iVar2 = bcmp(puVar8 + (long)ilen,local_480 + 8,slen);
              if (iVar2 != 0) {
                return -0x4380;
              }
              return 0;
            }
          }
          mbedtls_md_free(&local_498);
          iVar2 = -0x4100;
        }
        else {
          mbedtls_md_free(&local_498);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_rsassa_pss_verify_ext( mbedtls_rsa_context *ctx,
                               int (*f_rng)(void *, unsigned char *, size_t),
                               void *p_rng,
                               int mode,
                               mbedtls_md_type_t md_alg,
                               unsigned int hashlen,
                               const unsigned char *hash,
                               mbedtls_md_type_t mgf1_hash_id,
                               int expected_salt_len,
                               const unsigned char *sig )
{
    int ret;
    size_t siglen;
    unsigned char *p;
    unsigned char result[MBEDTLS_MD_MAX_SIZE];
    unsigned char zeros[8];
    unsigned int hlen;
    size_t slen, msb;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    siglen = ctx->len;

    if( siglen < 16 || siglen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, sig, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, buf );

    if( ret != 0 )
        return( ret );

    p = buf;

    if( buf[siglen - 1] != 0xBC )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( md_alg != MBEDTLS_MD_NONE )
    {
        /* Gather length of hash to sign */
        md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );
    }

    md_info = mbedtls_md_info_from_type( mgf1_hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );
    slen = siglen - hlen - 1; /* Currently length of salt + padding */

    memset( zeros, 0, 8 );

    /*
     * Note: EMSA-PSS verification is over the length of N - 1 bits
     */
    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;

    /* Compensate for boundary condition when applying mask */
    if( msb % 8 == 0 )
    {
        p++;
        siglen -= 1;
    }
    if( buf[0] >> ( 8 - siglen * 8 + msb ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
    {
        mbedtls_md_free( &md_ctx );
        return( ret );
    }

    mgf_mask( p, siglen - hlen - 1, p + siglen - hlen - 1, hlen, &md_ctx );

    buf[0] &= 0xFF >> ( siglen * 8 - msb );

    while( p < buf + siglen && *p == 0 )
        p++;

    if( p == buf + siglen ||
        *p++ != 0x01 )
    {
        mbedtls_md_free( &md_ctx );
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }

    /* Actual salt len */
    slen -= p - buf;

    if( expected_salt_len != MBEDTLS_RSA_SALT_LEN_ANY &&
        slen != (size_t) expected_salt_len )
    {
        mbedtls_md_free( &md_ctx );
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }

    /*
     * Generate H = Hash( M' )
     */
    mbedtls_md_starts( &md_ctx );
    mbedtls_md_update( &md_ctx, zeros, 8 );
    mbedtls_md_update( &md_ctx, hash, hashlen );
    mbedtls_md_update( &md_ctx, p, slen );
    mbedtls_md_finish( &md_ctx, result );

    mbedtls_md_free( &md_ctx );

    if( memcmp( p + slen, result, hlen ) == 0 )
        return( 0 );
    else
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );
}